

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tzgnames.cpp
# Opt level: O1

UChar * __thiscall
icu_63::TZGNCore::getPartialLocationName
          (TZGNCore *this,UnicodeString *tzCanonicalID,UnicodeString *mzID,UBool isLong,
          UnicodeString *mzDisplayName)

{
  ushort uVar1;
  UBool UVar2;
  int32_t iVar3;
  UChar *key_00;
  undefined8 *key_01;
  int *value;
  int len;
  bool bVar4;
  UErrorCode status;
  PartialLocationKey key;
  UnicodeString name;
  UnicodeString location;
  UnicodeString usCountryCode;
  UErrorCode local_10c;
  UChar *local_108;
  UChar *local_100;
  UBool local_f8;
  UnicodeString local_f0;
  UnicodeString local_b0;
  UnicodeString local_70;
  
  local_108 = ZoneMeta::findTimeZoneID(tzCanonicalID);
  local_100 = ZoneMeta::findMetaZoneID(mzID);
  local_f8 = isLong;
  key_00 = (UChar *)uhash_get_63(this->fPartialLocationNamesMap,&local_108);
  if (key_00 == (UChar *)0x0) {
    local_b0.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_0048be70;
    local_b0.fUnion.fStackFields.fLengthAndFlags = 2;
    local_70.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_0048be70;
    local_70.fUnion.fStackFields.fLengthAndFlags = 2;
    ZoneMeta::getCanonicalCountry(tzCanonicalID,&local_70,(UBool *)0x0);
    if ((ushort)local_70.fUnion.fStackFields.fLengthAndFlags < 0x20) {
      (*(this->fTimeZoneNames->super_UObject)._vptr_UObject[0xb])
                (this->fTimeZoneNames,tzCanonicalID,&local_b0);
      if ((ushort)local_b0.fUnion.fStackFields.fLengthAndFlags < 0x20) {
        icu_63::UnicodeString::copyFrom(&local_b0,tzCanonicalID,'\0');
      }
    }
    else {
      if (-1 < local_70.fUnion.fStackFields.fLengthAndFlags) {
        local_70.fUnion.fFields.fLength = (int)local_70.fUnion.fStackFields.fLengthAndFlags >> 5;
      }
      iVar3 = icu_63::UnicodeString::extract
                        (&local_70,0,local_70.fUnion.fFields.fLength,(char *)&local_10c,4,kInvariant
                        );
      *(undefined1 *)((long)&local_10c + (long)iVar3) = 0;
      local_f0.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_0048be70
      ;
      local_f0.fUnion.fStackFields.fLengthAndFlags = 2;
      (*(this->fTimeZoneNames->super_UObject)._vptr_UObject[8])
                (this->fTimeZoneNames,mzID,&local_10c);
      uVar1 = (tzCanonicalID->fUnion).fStackFields.fLengthAndFlags;
      if ((uVar1 & 1) == 0) {
        if ((short)uVar1 < 0) {
          len = (tzCanonicalID->fUnion).fFields.fLength;
        }
        else {
          len = (int)(short)uVar1 >> 5;
        }
        if (-1 < local_f0.fUnion.fStackFields.fLengthAndFlags) {
          local_f0.fUnion.fFields.fLength = (int)local_f0.fUnion.fStackFields.fLengthAndFlags >> 5;
        }
        bVar4 = false;
        if ((((int)local_f0.fUnion.fStackFields.fLengthAndFlags & 1U) == 0) &&
           (bVar4 = false, len == local_f0.fUnion.fFields.fLength)) {
          UVar2 = icu_63::UnicodeString::doEquals(tzCanonicalID,&local_f0,len);
          bVar4 = UVar2 != '\0';
        }
      }
      else {
        bVar4 = (bool)(local_f0.fUnion.fStackFields.fLengthAndFlags._0_1_ & 1);
      }
      if (bVar4 == false) {
        (*(this->fTimeZoneNames->super_UObject)._vptr_UObject[0xb])
                  (this->fTimeZoneNames,tzCanonicalID,&local_b0);
      }
      else {
        (*(this->fLocaleDisplayNames->super_UObject)._vptr_UObject[0xb])
                  (this->fLocaleDisplayNames,&local_10c,&local_b0);
      }
      icu_63::UnicodeString::~UnicodeString(&local_f0);
    }
    local_10c = U_ZERO_ERROR;
    local_f0.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_0048be70;
    local_f0.fUnion.fStackFields.fLengthAndFlags = 2;
    SimpleFormatter::format(&this->fFallbackFormat,&local_b0,mzDisplayName,&local_f0,&local_10c);
    if (local_10c < U_ILLEGAL_ARGUMENT_ERROR) {
      key_00 = ZNStringPool::get(&this->fStringPool,&local_f0,&local_10c);
      if ((local_10c < U_ILLEGAL_ARGUMENT_ERROR) &&
         (key_01 = (undefined8 *)uprv_malloc_63(0x18), key_01 != (undefined8 *)0x0)) {
        *key_01 = local_108;
        key_01[1] = local_100;
        *(UBool *)(key_01 + 2) = local_f8;
        uhash_put_63(this->fPartialLocationNamesMap,key_01,key_00,&local_10c);
        if (local_10c < U_ILLEGAL_ARGUMENT_ERROR) {
          value = (int *)uprv_malloc_63(0x10);
          if (value != (int *)0x0) {
            *value = (uint)(isLong == '\0') * 2 + 2;
            *(UChar **)(value + 2) = local_108;
            TextTrieMap::put(&this->fGNamesTrie,key_00,value,&local_10c);
          }
        }
        else {
          uprv_free_63(key_01);
        }
      }
    }
    else {
      key_00 = (UChar *)0x0;
    }
    icu_63::UnicodeString::~UnicodeString(&local_f0);
    icu_63::UnicodeString::~UnicodeString(&local_70);
    icu_63::UnicodeString::~UnicodeString(&local_b0);
  }
  return key_00;
}

Assistant:

const UChar*
TZGNCore::getPartialLocationName(const UnicodeString& tzCanonicalID,
                        const UnicodeString& mzID, UBool isLong, const UnicodeString& mzDisplayName) {
    U_ASSERT(!tzCanonicalID.isEmpty());
    U_ASSERT(!mzID.isEmpty());
    U_ASSERT(!mzDisplayName.isEmpty());

    PartialLocationKey key;
    key.tzID = ZoneMeta::findTimeZoneID(tzCanonicalID);
    key.mzID = ZoneMeta::findMetaZoneID(mzID);
    key.isLong = isLong;
    U_ASSERT(key.tzID != NULL && key.mzID != NULL);

    const UChar* uplname = (const UChar*)uhash_get(fPartialLocationNamesMap, (void *)&key);
    if (uplname != NULL) {
        return uplname;
    }

    UnicodeString location;
    UnicodeString usCountryCode;
    ZoneMeta::getCanonicalCountry(tzCanonicalID, usCountryCode);
    if (!usCountryCode.isEmpty()) {
        char countryCode[ULOC_COUNTRY_CAPACITY];
        U_ASSERT(usCountryCode.length() < ULOC_COUNTRY_CAPACITY);
        int32_t ccLen = usCountryCode.extract(0, usCountryCode.length(), countryCode, sizeof(countryCode), US_INV);
        countryCode[ccLen] = 0;

        UnicodeString regionalGolden;
        fTimeZoneNames->getReferenceZoneID(mzID, countryCode, regionalGolden);
        if (tzCanonicalID == regionalGolden) {
            // Use country name
            fLocaleDisplayNames->regionDisplayName(countryCode, location);
        } else {
            // Otherwise, use exemplar city name
            fTimeZoneNames->getExemplarLocationName(tzCanonicalID, location);
        }
    } else {
        fTimeZoneNames->getExemplarLocationName(tzCanonicalID, location);
        if (location.isEmpty()) {
            // This could happen when the time zone is not associated with a country,
            // and its ID is not hierarchical, for example, CST6CDT.
            // We use the canonical ID itself as the location for this case.
            location.setTo(tzCanonicalID);
        }
    }

    UErrorCode status = U_ZERO_ERROR;
    UnicodeString name;
    fFallbackFormat.format(location, mzDisplayName, name, status);
    if (U_FAILURE(status)) {
        return NULL;
    }

    uplname = fStringPool.get(name, status);
    if (U_SUCCESS(status)) {
        // Add the name to cache
        PartialLocationKey* cacheKey = (PartialLocationKey *)uprv_malloc(sizeof(PartialLocationKey));
        if (cacheKey != NULL) {
            cacheKey->tzID = key.tzID;
            cacheKey->mzID = key.mzID;
            cacheKey->isLong = key.isLong;
            uhash_put(fPartialLocationNamesMap, (void *)cacheKey, (void *)uplname, &status);
            if (U_FAILURE(status)) {
                uprv_free(cacheKey);
            } else {
                // put the name to the local trie as well
                GNameInfo *nameinfo = (ZNameInfo *)uprv_malloc(sizeof(GNameInfo));
                if (nameinfo != NULL) {
                    nameinfo->type = isLong ? UTZGNM_LONG : UTZGNM_SHORT;
                    nameinfo->tzID = key.tzID;
                    fGNamesTrie.put(uplname, nameinfo, status);
                }
            }
        }
    }
    return uplname;
}